

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserManager.hpp
# Opt level: O2

int __thiscall sjtu::UserManager::init(UserManager *this,EVP_PKEY_CTX *ctx)

{
  uint *puVar1;
  int iVar2;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *pBVar3;
  FileManager<sjtu::userType> *pFVar4;
  string *this_00;
  string local_2a0;
  string local_280 [32];
  string local_260;
  string local_240;
  ofstream outfile;
  
  if ((int)ctx == 0) {
    pBVar3 = (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *)
             operator_new(0x18);
    std::__cxx11::string::string((string *)&local_240,"UserBpTree.dat",(allocator *)&outfile);
    BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::BplusTree
              (pBVar3,&local_240,0x100);
    this->UserBpTree = pBVar3;
    std::__cxx11::string::~string((string *)&local_240);
    pFVar4 = (FileManager<sjtu::userType> *)operator_new(0x228);
    std::__cxx11::string::string((string *)&local_260,"UserFile.dat",(allocator *)&outfile);
    FileManager<sjtu::userType>::FileManager(pFVar4,&local_260,0x20);
    this->UserFile = pFVar4;
    this_00 = &local_260;
  }
  else {
    pBVar3 = this->UserBpTree;
    std::__cxx11::string::string(local_280,"UserBpTree.dat",(allocator *)&outfile);
    BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::init
              (pBVar3,(EVP_PKEY_CTX *)local_280);
    std::__cxx11::string::~string(local_280);
    pFVar4 = this->UserFile;
    std::__cxx11::string::string((string *)&local_2a0,"UserFile.dat",(allocator *)&outfile);
    (**(pFVar4->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base)
              (pFVar4,&local_2a0,0x20,1);
    this_00 = &local_2a0;
  }
  std::__cxx11::string::~string((string *)this_00);
  puVar1 = &this->online_flag;
  if ((this->UserFile->super_FileManager_Base<sjtu::userType>).is_newfile == true) {
    std::ofstream::ofstream(&outfile,"OnlineFlag.dat",_S_out|_S_bin);
    *puVar1 = 0;
    std::ostream::write((char *)&outfile,(long)puVar1);
    std::ofstream::close();
    iVar2 = std::ofstream::~ofstream(&outfile);
  }
  else {
    std::ifstream::ifstream(&outfile,"OnlineFlag.dat",_S_in);
    std::istream::read((char *)&outfile,(long)puVar1);
    std::ifstream::close();
    iVar2 = std::ifstream::~ifstream(&outfile);
  }
  this->online_flag = this->online_flag + 1;
  return iVar2;
}

Assistant:

void init(bool obj = false) {
            if (obj == false) {
                UserBpTree = new BplusTree<StringHasher::hashType, locType>(std::string("UserBpTree.dat") , UserBpTree_cache_size);
                UserFile = new FileManager<userType>(std::string("UserFile.dat") , UserFile_cache_size);
            } else {
                UserBpTree->init(std::string("UserBpTree.dat") , UserBpTree_cache_size , true);
                UserFile->init(std::string("UserFile.dat") , UserFile_cache_size , true);
            }
            if (UserFile -> is_newfile)
            {
            	std::ofstream outfile("OnlineFlag.dat" , std::ios_base::out | std::ios_base::binary);
            	online_flag = 0 , outfile.write(reinterpret_cast<char *>(&online_flag) , sizeof (unsigned int));
            	outfile.close();
            }
            else
            {
            	std::ifstream infile("OnlineFlag.dat" , std::ios_base::in);
            	infile.read(reinterpret_cast<char *>(&online_flag) , sizeof (unsigned int));
            	infile.close();
            }
            ++ online_flag;
        }